

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

deUint32 __thiscall
vkt::synchronization::anon_unknown_0::ClearAttachments::Support::getResourceUsageFlags
          (Support *this)

{
  deUint32 dVar1;
  uint uVar2;
  
  uVar2 = (this->m_resourceDesc).imageAspect - 1;
  dVar1 = 0;
  if (uVar2 < 4) {
    dVar1 = *(deUint32 *)(&DAT_00b24b70 + (ulong)uVar2 * 4);
  }
  return dVar1;
}

Assistant:

deUint32 getResourceUsageFlags (void) const
	{
		switch (m_resourceDesc.imageAspect)
		{
			case VK_IMAGE_ASPECT_COLOR_BIT:
				return VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT;
			case VK_IMAGE_ASPECT_STENCIL_BIT:
			case VK_IMAGE_ASPECT_DEPTH_BIT:
				return VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;
			default:
				DE_ASSERT(0);
		}
		return 0u;
	}